

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O3

int quicly_remote_cid_register
              (quicly_remote_cid_set_t *set,uint64_t sequence,uint8_t *cid,size_t cid_len,
              uint8_t *srt,uint64_t retire_prior_to,uint64_t *unregistered_seqs,
              size_t *num_unregistered_seqs)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  size_t idx_to_unreg;
  long lVar17;
  size_t sVar18;
  uint64_t *puVar19;
  undefined1 auVar20 [16];
  quicly_remote_cid_t backup_cid;
  
  uVar2 = *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb);
  iVar11 = set->cids[0].is_active;
  uVar12 = *(undefined4 *)&set->cids[0].field_0x4;
  uVar4 = set->cids[0].sequence;
  uVar6 = *(undefined8 *)set->cids[0].cid.cid;
  uVar7 = *(undefined8 *)(set->cids[0].cid.cid + 8);
  uVar8 = *(undefined8 *)(set->cids[0].cid.cid + 0x10);
  uVar9 = *(undefined8 *)(set->cids[0].stateless_reset_token + 3);
  if (sequence < retire_prior_to) {
    __assert_fail("sequence >= retire_prior_to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0xba,
                  "int quicly_remote_cid_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *, uint64_t, uint64_t *, size_t *)"
                 );
  }
  puVar19 = &set->cids[0].sequence;
  sVar18 = 0xffffffffffffffff;
  idx_to_unreg = 0;
  sVar16 = 0;
  uVar14 = 0xffffffffffffffff;
  do {
    uVar15 = uVar14;
    if (((quicly_remote_cid_t *)(puVar19 + -1))->is_active != 0) {
      uVar3 = *puVar19;
      if (uVar3 < retire_prior_to) {
        unregistered_seqs[sVar16] = uVar3;
        sVar16 = sVar16 + 1;
        do_unregister(set,idx_to_unreg);
      }
      else {
        if (uVar3 <= uVar14) {
          uVar15 = uVar3;
        }
        if (uVar3 < uVar14) {
          sVar18 = idx_to_unreg;
        }
      }
    }
    idx_to_unreg = idx_to_unreg + 1;
    puVar19 = puVar19 + 7;
    uVar14 = uVar15;
  } while (idx_to_unreg != 4);
  if ((set->cids[0].is_active == 0) && (sVar18 != 0xffffffffffffffff)) {
    promote_cid(set,sVar18);
  }
  *num_unregistered_seqs = sVar16;
  iVar13 = 0x20009;
  if (set->_largest_sequence_expected < sequence) {
LAB_00124b03:
    if (set->cids[0].is_active == 0) {
      *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb) = uVar2;
      *(undefined8 *)(set->cids[0].cid.cid + 0x10) = uVar8;
      *(undefined8 *)(set->cids[0].stateless_reset_token + 3) = uVar9;
      *(undefined8 *)set->cids[0].cid.cid = uVar6;
      *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar7;
      set->cids[0].is_active = iVar11;
      *(undefined4 *)&set->cids[0].field_0x4 = uVar12;
      set->cids[0].sequence = uVar4;
    }
  }
  else {
    lVar17 = 0;
    bVar10 = false;
    sVar18 = 0;
    do {
      if (*(int *)(set->cids[0].cid.cid + lVar17 + -0x10) == 0) {
        if (*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) == sequence) {
          if (bVar10) {
            __assert_fail("!was_stored",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                          ,0x60,
                          "int do_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *)"
                         );
          }
          puVar1 = set->cids[0].cid.cid + lVar17 + -0x10;
          *(uint64_t *)(puVar1 + 8) = sequence;
          memcpy(puVar1 + 0x10,cid,cid_len);
          puVar1[0x24] = (char)cid_len;
          uVar5 = *(undefined8 *)(srt + 8);
          *(undefined8 *)(puVar1 + 0x25) = *(undefined8 *)srt;
          *(undefined8 *)(puVar1 + 0x2d) = uVar5;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          bVar10 = true;
          if ((lVar17 != 0) && (set->cids[0].is_active == 0)) {
            promote_cid(set,sVar18);
          }
        }
      }
      else {
        if (set->cids[0].cid.cid[lVar17 + 0x14] == cid_len) {
          iVar13 = bcmp(set->cids[0].cid.cid + lVar17,cid,cid_len);
          if (iVar13 == 0) {
            iVar13 = 0x2000a;
            if (*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) != sequence) goto LAB_00124b03;
            puVar1 = set->cids[0].stateless_reset_token + lVar17;
            auVar20[0] = -(*srt == *puVar1);
            auVar20[1] = -(srt[1] == puVar1[1]);
            auVar20[2] = -(srt[2] == puVar1[2]);
            auVar20[3] = -(srt[3] == puVar1[3]);
            auVar20[4] = -(srt[4] == puVar1[4]);
            auVar20[5] = -(srt[5] == puVar1[5]);
            auVar20[6] = -(srt[6] == puVar1[6]);
            auVar20[7] = -(srt[7] == puVar1[7]);
            auVar20[8] = -(srt[8] == puVar1[8]);
            auVar20[9] = -(srt[9] == puVar1[9]);
            auVar20[10] = -(srt[10] == puVar1[10]);
            auVar20[0xb] = -(srt[0xb] == puVar1[0xb]);
            auVar20[0xc] = -(srt[0xc] == puVar1[0xc]);
            auVar20[0xd] = -(srt[0xd] == puVar1[0xd]);
            auVar20[0xe] = -(srt[0xe] == puVar1[0xe]);
            auVar20[0xf] = -(srt[0xf] == puVar1[0xf]);
            if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar20[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00124b03;
            break;
          }
        }
        if (*(uint64_t *)(set->cids[0].cid.cid + lVar17 + -8) == sequence) {
          iVar13 = 0x2000a;
          goto LAB_00124b03;
        }
      }
      sVar18 = sVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar17 != 0xe0);
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int quicly_remote_cid_register(quicly_remote_cid_set_t *set, uint64_t sequence, const uint8_t *cid, size_t cid_len,
                               const uint8_t srt[QUICLY_STATELESS_RESET_TOKEN_LEN], uint64_t retire_prior_to,
                               uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT], size_t *num_unregistered_seqs)
{
    quicly_remote_cid_t backup_cid = set->cids[0]; // preserve one valid entry in cids[0] to handle protocol violation
    int ret;

    assert(sequence >= retire_prior_to);

    /* First, handle retire_prior_to. This order is important as it is possible to receive a NEW_CONNECTION_ID frame such that it
     * retires active_connection_id_limit CIDs and then installs one new CID. */
    *num_unregistered_seqs = unregister_prior_to(set, retire_prior_to, unregistered_seqs);

    /* Then, register given value. */
    if ((ret = do_register(set, sequence, cid, cid_len, srt)) != 0) {
        /* restore the backup and send the error */
        if (!set->cids[0].is_active)
            set->cids[0] = backup_cid;
        return ret;
    }

    return ret;
}